

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O2

bool __thiscall
cmCTestCurl::UploadFile
          (cmCTestCurl *this,string *param_1,string *url,string *fields,string *response)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  bool bVar3;
  FILE *__stream;
  unsigned_long uVar4;
  curl_slist *list;
  ostream *poVar5;
  pointer pbVar6;
  string curlDebug;
  vector<char,_std::allocator<char>_> debugData;
  char *local_208 [4];
  vector<char,_std::allocator<char>_> responseData;
  string upload_url;
  ostringstream cmCTestLog_msg;
  undefined1 local_198 [360];
  
  response->_M_string_length = 0;
  *(response->_M_dataplus)._M_p = '\0';
  bVar3 = InitCurl(this);
  if (bVar3) {
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_UPLOAD,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_PUT,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_VERBOSE,1);
    __stream = (FILE *)cmsys::SystemTools::Fopen(param_1,"rb");
    if (__stream != (FILE *)0x0) {
      _cmCTestLog_msg = (undefined1 *)url->_M_string_length;
      curlDebug._M_string_length = (size_type)&curlDebug.field_2;
      curlDebug._M_dataplus._M_p = &DAT_00000001;
      curlDebug.field_2._M_local_buf[0] = '?';
      cmStrCat<std::__cxx11::string>
                (&upload_url,(cmAlphaNum *)&cmCTestLog_msg,(cmAlphaNum *)&curlDebug,fields);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_URL,upload_url._M_dataplus._M_p);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_READDATA,__stream);
      uVar4 = cmsys::SystemTools::FileLength(param_1);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_INFILESIZE,uVar4);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEFUNCTION,
                       anon_unknown.dwarf_347cce::curlWriteMemoryCallback);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGFUNCTION,
                       anon_unknown.dwarf_347cce::curlDebugCallback);
      list = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
      pbVar1 = (this->HttpHeaders).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = (this->HttpHeaders).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1
          ) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"   Add HTTP Header: \"");
        poVar5 = std::operator<<(poVar5,(string *)pbVar6);
        poVar5 = std::operator<<(poVar5,"\"");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0x96,curlDebug._M_dataplus._M_p,this->Quiet);
        std::__cxx11::string::~string((string *)&curlDebug);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        list = curl_slist_append(list,(pbVar6->_M_dataplus)._M_p);
      }
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,list);
      responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEDATA);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGDATA,&debugData);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FAILONERROR,1);
      curl_easy_perform((Curl_easy *)this->Curl);
      fclose(__stream);
      curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,0);
      curl_slist_free_all(list);
      if (responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          responseData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        _cmCTestLog_msg = local_198;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)&cmCTestLog_msg);
        std::__cxx11::string::operator=((string *)response,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Curl response: [");
        poVar5 = std::operator<<(poVar5,(string *)response);
        std::operator<<(poVar5,"]\n");
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xa8,curlDebug._M_dataplus._M_p,this->Quiet);
        std::__cxx11::string::~string((string *)&curlDebug);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      curlDebug._M_dataplus._M_p = (pointer)&curlDebug.field_2;
      curlDebug._M_string_length = 0;
      curlDebug.field_2._M_local_buf[0] = '\0';
      if (debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          debugData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        _cmCTestLog_msg = local_198;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)&cmCTestLog_msg);
        std::__cxx11::string::operator=((string *)&curlDebug,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Curl debug: [");
        poVar5 = std::operator<<(poVar5,(string *)&curlDebug);
        std::operator<<(poVar5,"]\n");
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xae,local_208[0],this->Quiet);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      bVar3 = response->_M_string_length != 0;
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"No response from server.\n");
        std::operator<<(poVar5,(string *)&curlDebug);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xb3,local_208[0],false);
        std::__cxx11::string::~string((string *)local_208);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      std::__cxx11::string::~string((string *)&curlDebug);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&debugData.super__Vector_base<char,_std::allocator<char>_>);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&responseData.super__Vector_base<char,_std::allocator<char>_>);
      std::__cxx11::string::~string((string *)&upload_url);
      return bVar3;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Could not open file for upload: ");
    poVar5 = std::operator<<(poVar5,(string *)param_1);
    std::operator<<(poVar5,"\n");
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0x80,curlDebug._M_dataplus._M_p,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"Initialization of curl failed");
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0x73,curlDebug._M_dataplus._M_p,false);
  }
  std::__cxx11::string::~string((string *)&curlDebug);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  return false;
}

Assistant:

bool cmCTestCurl::UploadFile(std::string const& local_file,
                             std::string const& url, std::string const& fields,
                             std::string& response)
{
  response.clear();
  if (!this->InitCurl()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed");
    return false;
  }
  /* enable uploading */
  curl_easy_setopt(this->Curl, CURLOPT_UPLOAD, 1);

  /* HTTP PUT please */
  ::curl_easy_setopt(this->Curl, CURLOPT_PUT, 1);
  ::curl_easy_setopt(this->Curl, CURLOPT_VERBOSE, 1);

  FILE* ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
  if (!ftpfile) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Could not open file for upload: " << local_file << "\n");
    return false;
  }
  // set the url
  std::string upload_url = cmStrCat(url, '?', fields);
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, upload_url.c_str());
  // now specify which file to upload
  ::curl_easy_setopt(this->Curl, CURLOPT_INFILE, ftpfile);
  unsigned long filelen = cmSystemTools::FileLength(local_file);
  // and give the size of the upload (optional)
  ::curl_easy_setopt(this->Curl, CURLOPT_INFILESIZE,
                     static_cast<long>(filelen));
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION, curlDebugCallback);
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");
  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, headers);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, &responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, &debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);
  // Now run off and do what you've been told!
  ::curl_easy_perform(this->Curl);
  ::fclose(ftpfile);
  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, NULL);
  ::curl_slist_free_all(headers);

  if (!responseData.empty()) {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Curl response: [" << response << "]\n", this->Quiet);
  }
  std::string curlDebug;
  if (!debugData.empty()) {
    curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl debug: [" << curlDebug << "]\n", this->Quiet);
  }
  if (response.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "No response from server.\n"
                 << curlDebug);
    return false;
  }
  return true;
}